

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O1

void __thiscall
QRhiImplementation::updateLayoutDesc(QRhiImplementation *this,QRhiShaderResourceBindings *srb)

{
  long lVar1;
  back_insert_iterator<QList<unsigned_int>_> dst;
  Type TVar2;
  Data *pDVar3;
  QRhiShaderResourceBinding *b;
  Data *this_00;
  
  srb->m_layoutDescHash = 0;
  dst.container = &srb->m_layoutDesc;
  QList<unsigned_int>::clear(dst.container);
  lVar1 = (srb->m_bindings).super_QVLABase<QRhiShaderResourceBinding>.super_QVLABaseBase.s;
  if (lVar1 != 0) {
    this_00 = (Data *)(srb->m_bindings).super_QVLABase<QRhiShaderResourceBinding>.super_QVLABaseBase
                      .ptr;
    pDVar3 = this_00 + lVar1;
    do {
      TVar2 = SampledTexture;
      if (this_00->type - SampledTexture < 2) {
        TVar2 = (this_00->u).stex.count;
      }
      srb->m_layoutDescHash =
           srb->m_layoutDescHash ^
           (ulong)((this_00->stage).
                   super_QFlagsStorageHelper<QRhiShaderResourceBinding::StageFlag,_4>.
                   super_QFlagsStorage<QRhiShaderResourceBinding::StageFlag>.i ^ this_00->binding ^
                   this_00->type ^ TVar2);
      dst = QRhiShaderResourceBinding::Data::
            serialize<std::back_insert_iterator<QList<unsigned_int>>>(this_00,dst);
      this_00 = this_00 + 1;
    } while (this_00 != pDVar3);
  }
  return;
}

Assistant:

void QRhiImplementation::updateLayoutDesc(QRhiShaderResourceBindings *srb)
{
    srb->m_layoutDescHash = 0;
    srb->m_layoutDesc.clear();
    auto layoutDescAppender = std::back_inserter(srb->m_layoutDesc);
    for (const QRhiShaderResourceBinding &b : std::as_const(srb->m_bindings)) {
        const QRhiShaderResourceBinding::Data *d = &b.d;
        srb->m_layoutDescHash ^= uint(d->binding) ^ uint(d->stage) ^ uint(d->type)
            ^ uint(d->arraySize());
        layoutDescAppender = d->serialize(layoutDescAppender);
    }
}